

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O3

HighsInt Highs_setBasis(void *highs,HighsInt *col_status,HighsInt *row_status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  HighsStatus HVar2;
  HighsInt i;
  size_type sVar3;
  size_type sVar4;
  string local_a8;
  HighsBasis local_88;
  
  paVar1 = &local_88.debug_origin_name.field_2;
  local_88.valid = false;
  local_88.alien = true;
  local_88.useful = false;
  local_88.was_alien = true;
  local_88.debug_id = -1;
  local_88.debug_update_count = -1;
  local_88.debug_origin_name.field_2._M_allocated_capacity._0_4_ = 0x656e6f4e;
  local_88.debug_origin_name._M_string_length = 4;
  local_88.debug_origin_name.field_2._M_local_buf[4] = '\0';
  local_88.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar4 = (size_type)*(int *)((long)highs + 0x138);
  local_88.debug_origin_name._M_dataplus._M_p = (pointer)paVar1;
  if (0 < (long)sVar4) {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&local_88.col_status,sVar4);
    sVar3 = 0;
    do {
      if (4 < (uint)col_status[sVar3]) goto LAB_001e6490;
      local_88.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start[sVar3] = (HighsBasisStatus)col_status[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar4 != sVar3);
  }
  sVar4 = (size_type)*(int *)((long)highs + 0x13c);
  if (0 < (long)sVar4) {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&local_88.row_status,sVar4);
    sVar3 = 0;
    do {
      if (4 < (uint)row_status[sVar3]) goto LAB_001e6490;
      local_88.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start[sVar3] = (HighsBasisStatus)row_status[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar4 != sVar3);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  HVar2 = Highs::setBasis((Highs *)highs,&local_88,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
LAB_001e6495:
  if (local_88.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.row_status.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_88.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.col_status.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.debug_origin_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.debug_origin_name._M_dataplus._M_p);
  }
  return HVar2;
LAB_001e6490:
  HVar2 = kError;
  goto LAB_001e6495;
}

Assistant:

HighsInt Highs_setBasis(void* highs, const HighsInt* col_status,
                        const HighsInt* row_status) {
  HighsBasis basis;
  const HighsInt num__col = Highs_getNumCol(highs);
  if (num__col > 0) {
    basis.col_status.resize(num__col);
    for (HighsInt i = 0; i < num__col; i++) {
      if (col_status[i] == (HighsInt)HighsBasisStatus::kLower) {
        basis.col_status[i] = HighsBasisStatus::kLower;
      } else if (col_status[i] == (HighsInt)HighsBasisStatus::kBasic) {
        basis.col_status[i] = HighsBasisStatus::kBasic;
      } else if (col_status[i] == (HighsInt)HighsBasisStatus::kUpper) {
        basis.col_status[i] = HighsBasisStatus::kUpper;
      } else if (col_status[i] == (HighsInt)HighsBasisStatus::kZero) {
        basis.col_status[i] = HighsBasisStatus::kZero;
      } else if (col_status[i] == (HighsInt)HighsBasisStatus::kNonbasic) {
        basis.col_status[i] = HighsBasisStatus::kNonbasic;
      } else {
        return (HighsInt)HighsStatus::kError;
      }
    }
  }
  const HighsInt num__row = Highs_getNumRow(highs);
  if (num__row > 0) {
    basis.row_status.resize(num__row);
    for (HighsInt i = 0; i < num__row; i++) {
      if (row_status[i] == (HighsInt)HighsBasisStatus::kLower) {
        basis.row_status[i] = HighsBasisStatus::kLower;
      } else if (row_status[i] == (HighsInt)HighsBasisStatus::kBasic) {
        basis.row_status[i] = HighsBasisStatus::kBasic;
      } else if (row_status[i] == (HighsInt)HighsBasisStatus::kUpper) {
        basis.row_status[i] = HighsBasisStatus::kUpper;
      } else if (row_status[i] == (HighsInt)HighsBasisStatus::kZero) {
        basis.row_status[i] = HighsBasisStatus::kZero;
      } else if (row_status[i] == (HighsInt)HighsBasisStatus::kNonbasic) {
        basis.row_status[i] = HighsBasisStatus::kNonbasic;
      } else {
        return (HighsInt)HighsStatus::kError;
      }
    }
  }
  return (HighsInt)((Highs*)highs)->setBasis(basis);
}